

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

Expression * __thiscall
wasm::OptimizeInstructions::combineAnd(OptimizeInstructions *this,Binary *curr)

{
  UnaryOp UVar1;
  Expression *pEVar2;
  ulong uVar3;
  Expression *pEVar4;
  Const *pCVar5;
  bool bVar6;
  UnaryOp UVar7;
  BinaryOp BVar8;
  Binary *pBVar9;
  Expression *pEVar10;
  Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
  local_e8;
  Literal local_b8;
  anon_union_16_6_1532cd5a_for_Literal_0 local_a0;
  Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
  local_90;
  Const *local_60;
  OptimizeInstructions *local_58;
  Expression *local_50;
  Const *cx;
  Const *cy;
  undefined1 local_31;
  
  local_58 = this;
  if (curr->op != AndInt32) {
    __assert_fail("curr->op == AndInt32",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                  ,0xda5,"Expression *wasm::OptimizeInstructions::combineAnd(Binary *)");
  }
  pEVar10 = curr->left;
  if (((pEVar10->_id == UnaryId) &&
      (UVar1 = *(UnaryOp *)(pEVar10 + 1),
      UVar7 = Match::Internal::AbstractUnaryOpK::getOp
                        ((Type)*(uintptr_t *)(pEVar10[1].type.id + 8),EqZ), UVar1 == UVar7)) &&
     (pEVar2 = curr->right, pEVar2->_id == UnaryId)) {
    pEVar10 = (Expression *)pEVar10[1].type.id;
    UVar1 = *(UnaryOp *)(pEVar2 + 1);
    UVar7 = Match::Internal::AbstractUnaryOpK::getOp
                      ((Type)*(uintptr_t *)(pEVar2[1].type.id + 8),EqZ);
    if (UVar1 == UVar7) {
      pEVar2 = (Expression *)pEVar2[1].type.id;
      uVar3 = (pEVar10->type).id;
      if (uVar3 == (pEVar2->type).id) {
        pEVar4 = curr->left;
        if (pEVar4->_id != UnaryId) {
          __assert_fail("int(_id) == int(T::SpecificId)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                        ,0x31b,"T *wasm::Expression::cast() [T = wasm::Unary]");
        }
        if (uVar3 < 7) {
          BVar8 = *(BinaryOp *)(&DAT_00df92bc + uVar3 * 4);
          pBVar9 = (Binary *)
                   MixedArena::allocSpace
                             (&((local_58->
                                super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                ).
                                super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                .
                                super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                               .currModule)->allocator,0x28,8);
          (pBVar9->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id =
               BinaryId;
          (pBVar9->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
          pBVar9->op = BVar8;
          pBVar9->left = pEVar10;
          pBVar9->right = pEVar2;
          Binary::finalize(pBVar9);
          pEVar4[1].type.id = (uintptr_t)pBVar9;
          return pEVar4;
        }
        __assert_fail("isBasic() && \"Basic type expected\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                      ,0x1c4,"BasicType wasm::Type::getBasic() const");
      }
    }
  }
  pBVar9 = (Binary *)curr->left;
  local_e8.binder = (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
  local_e8.submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
  if (((pBVar9->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id == BinaryId
      ) && (local_50 = pBVar9->right, local_50->_id == ConstId)) {
    cy = (Const *)pBVar9->left;
    Literal::Literal((Literal *)&local_a0.func,(Literal *)(local_50 + 1));
    bVar6 = Match::Internal::
            Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
            ::matches(&local_e8,
                      (candidate_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)
                      &local_a0.func);
    Literal::~Literal((Literal *)&local_a0.func);
    if (!bVar6) goto LAB_009db36e;
    pEVar10 = curr->right;
    local_90.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_90.submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
    local_a0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&cx;
    if ((pEVar10->_id != BinaryId) ||
       (pCVar5 = *(Const **)(pEVar10 + 2),
       (pCVar5->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id != ConstId)
       ) goto LAB_009db36e;
    local_60 = (Const *)pEVar10[1].type.id;
    cx = pCVar5;
    Literal::Literal(&local_b8,&pCVar5->value);
    local_31 = Match::Internal::
               Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
               ::matches(&local_90,&local_b8);
    Literal::~Literal(&local_b8);
    if (((local_31 == '\0') ||
        (((pBVar9->op != *(BinaryOp *)(pEVar10 + 1) ||
          ((cy->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id !=
           (local_60->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id))
         || (bVar6 = Literal::operator==((Literal *)(local_50 + 1),&cx->value), !bVar6)))) ||
       (bVar6 = inversesAnd(local_58,pBVar9), pCVar5 = cy, !bVar6)) goto LAB_009db36e;
    BVar8 = Abstract::getBinary((Type)(cy->super_SpecificExpression<(wasm::Expression::Id)14>).
                                      super_Expression.type.id,Or);
    *(BinaryOp *)(pEVar10 + 1) = BVar8;
    (pEVar10->type).id =
         (pCVar5->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id;
    pEVar10[1].type.id = (uintptr_t)pCVar5;
LAB_009db4bf:
    *(Const **)(pEVar10 + 2) = local_60;
    pBVar9->left = pEVar10;
  }
  else {
LAB_009db36e:
    pBVar9 = (Binary *)curr->left;
    local_e8.binder =
         (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
    local_e8.submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
    if (((pBVar9->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id ==
         BinaryId) && (local_50 = pBVar9->right, local_50->_id == ConstId)) {
      pEVar2 = pBVar9->left;
      Literal::Literal((Literal *)&local_a0.func,(Literal *)(local_50 + 1));
      bVar6 = Match::Internal::
              Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
              ::matches(&local_e8,
                        (candidate_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_>
                         *)&local_a0.func);
      Literal::~Literal((Literal *)&local_a0.func);
      if (bVar6) {
        pEVar10 = curr->right;
        local_90.binder =
             (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>_> *)0x0;
        local_90.submatchers.curr.binder = (matched_t<wasm::Match::Internal::AnyKind<long>_> *)0x0;
        local_a0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&cx;
        if ((pEVar10->_id == BinaryId) &&
           (cx = *(Const **)(pEVar10 + 2),
           (cx->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id == ConstId)
           ) {
          cy = (Const *)pEVar10[1].type.id;
          Literal::Literal(&local_b8,&cx->value);
          bVar6 = Match::Internal::
                  Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>
                  ::matches(&local_90,&local_b8);
          Literal::~Literal(&local_b8);
          if ((bVar6) &&
             ((((pBVar9->op == *(BinaryOp *)(pEVar10 + 1) &&
                ((pEVar2->type).id ==
                 (cy->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id))
               && (bVar6 = Literal::operator==((Literal *)(local_50 + 1),&cx->value), bVar6)) &&
              (bVar6 = preserveAnd(local_58,pBVar9), bVar6)))) {
            BVar8 = Abstract::getBinary((Type)(pEVar2->type).id,And);
            *(BinaryOp *)(pEVar10 + 1) = BVar8;
            (pEVar10->type).id = (pEVar2->type).id;
            pEVar10[1].type.id = (uintptr_t)pEVar2;
            local_60 = cy;
            goto LAB_009db4bf;
          }
        }
      }
    }
    pBVar9 = (Binary *)0x0;
  }
  return (Expression *)pBVar9;
}

Assistant:

Expression* combineAnd(Binary* curr) {
    assert(curr->op == AndInt32);

    using namespace Abstract;
    using namespace Match;

    {
      // (i32(x) == 0) & (i32(y) == 0)   ==>   i32(x | y) == 0
      // (i64(x) == 0) & (i64(y) == 0)   ==>   i64(x | y) == 0
      Expression *x, *y;
      if (matches(curr->left, unary(EqZ, any(&x))) &&
          matches(curr->right, unary(EqZ, any(&y))) && x->type == y->type) {
        auto* inner = curr->left->cast<Unary>();
        inner->value =
          Builder(*getModule()).makeBinary(getBinary(x->type, Or), x, y);
        return inner;
      }
    }
    {
      // Binary operations that inverse a bitwise AND can be
      // reordered. If F(x) = binary(x, c), and F(x) preserves AND,
      // that is,
      //
      //   F(x) & F(y) == F(x | y)
      //
      // Then also
      //
      //   binary(x, c) & binary(y, c)  =>  binary(x | y, c)
      Binary *bx, *by;
      Expression *x, *y;
      Const *cx, *cy;
      if (matches(curr->left, binary(&bx, any(&x), ival(&cx))) &&
          matches(curr->right, binary(&by, any(&y), ival(&cy))) &&
          bx->op == by->op && x->type == y->type && cx->value == cy->value &&
          inversesAnd(bx)) {
        by->op = getBinary(x->type, Or);
        by->type = x->type;
        by->left = x;
        by->right = y;
        bx->left = by;
        return bx;
      }
    }
    {
      // Binary operations that preserve a bitwise AND can be
      // reordered. If F(x) = binary(x, c), and F(x) preserves AND,
      // that is,
      //
      //   F(x) & F(y) == F(x & y)
      //
      // Then also
      //
      //   binary(x, c) & binary(y, c)  =>  binary(x & y, c)
      Binary *bx, *by;
      Expression *x, *y;
      Const *cx, *cy;
      if (matches(curr->left, binary(&bx, any(&x), ival(&cx))) &&
          matches(curr->right, binary(&by, any(&y), ival(&cy))) &&
          bx->op == by->op && x->type == y->type && cx->value == cy->value &&
          preserveAnd(bx)) {
        by->op = getBinary(x->type, And);
        by->type = x->type;
        by->left = x;
        by->right = y;
        bx->left = by;
        return bx;
      }
    }
    return nullptr;
  }